

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::AddState(GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *this,Stack<rapidjson::CrtAllocator> *l,SizeType index)

{
  SizeType *pSVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  uint *puVar5;
  byte bVar6;
  
  if (index != 0xffffffff) {
    bVar6 = 0;
    do {
      if (this->regex_->stateCount_ <= index) {
        __assert_fail("index < stateCount_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                      ,0xaf,
                      "const State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      pcVar3 = (this->regex_->states_).stack_;
      pSVar1 = (SizeType *)(pcVar3 + (ulong)index * 0x10);
      if (*(int *)(pcVar3 + (ulong)index * 0x10 + 4) == -1) {
        uVar2 = this->stateSet_[index >> 5];
        if ((uVar2 >> (index & 0x1f) & 1) == 0) {
          this->stateSet_[index >> 5] = uVar2 | 1 << ((byte)index & 0x1f);
          puVar5 = Stack<rapidjson::CrtAllocator>::PushUnsafe<unsigned_int>(l,1);
          *puVar5 = index;
        }
        return (bool)(bVar6 | *pSVar1 == 0xffffffff);
      }
      bVar4 = AddState(this,l,*pSVar1);
      index = pSVar1[1];
      bVar6 = bVar6 | bVar4;
    } while (index != 0xffffffff);
  }
  __assert_fail("index != kRegexInvalidState",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                ,0x2b4,
                "bool rapidjson::internal::GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<>>>::AddState(Stack<Allocator> &, SizeType) [RegexType = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool AddState(Stack<Allocator>& l, SizeType index) {
        RAPIDJSON_ASSERT(index != kRegexInvalidState);

        const State& s = regex_.GetState(index);
        if (s.out1 != kRegexInvalidState) { // Split
            bool matched = AddState(l, s.out);
            return AddState(l, s.out1) || matched;
        }
        else if (!(stateSet_[index >> 5] & (1u << (index & 31)))) {
            stateSet_[index >> 5] |= (1u << (index & 31));
            *l.template PushUnsafe<SizeType>() = index;
        }
        return s.out == kRegexInvalidState; // by using PushUnsafe() above, we can ensure s is not validated due to reallocation.
    }